

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O3

BufferHandle * __thiscall
duckdb::CachingFileHandle::Read
          (BufferHandle *__return_storage_ptr__,CachingFileHandle *this,data_ptr_t *buffer,
          idx_t nr_bytes,idx_t location)

{
  BufferManager *pBVar1;
  bool bVar2;
  idx_t iVar3;
  FileHandle *pFVar4;
  data_ptr_t buffer_00;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *new_file_range_00;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *extraout_RDX;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *new_file_range_01;
  BufferHandle result;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> new_file_range;
  vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_true>
  overlapping_ranges;
  idx_t local_a0;
  idx_t local_98;
  undefined1 local_89;
  BufferHandle local_88;
  BufferHandle local_70;
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> local_58;
  BufferHandle local_48;
  
  local_a0 = location;
  local_98 = nr_bytes;
  BufferHandle::BufferHandle(&local_88);
  iVar3 = local_98;
  if (((this->external_file_cache->enable)._M_base._M_i & 1U) == 0) {
    pBVar1 = this->external_file_cache->buffer_manager;
    (*pBVar1->_vptr_BufferManager[4])(&local_48,pBVar1,0xd,local_98,1);
    BufferHandle::operator=(&local_88,&local_48);
    BufferHandle::~BufferHandle(&local_48);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_88.node);
    *buffer = (local_88.node.ptr)->buffer;
    pFVar4 = GetFileHandle(this);
    FileHandle::Read(pFVar4,*buffer,iVar3,local_a0);
    BufferHandle::BufferHandle(__return_storage_ptr__,&local_88);
    goto LAB_0063c5df;
  }
  local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_48.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.node.ptr = (FileBuffer *)0x0;
  TryReadFromCache(&local_70,this,buffer,local_98,local_a0,
                   (vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_true>
                    *)&local_48);
  BufferHandle::operator=(&local_88,&local_70);
  BufferHandle::~BufferHandle(&local_70);
  bVar2 = BufferHandle::IsValid(&local_88);
  if (bVar2) {
    BufferHandle::BufferHandle(__return_storage_ptr__,&local_88);
  }
  else {
    pBVar1 = this->external_file_cache->buffer_manager;
    (*pBVar1->_vptr_BufferManager[4])(&local_70,pBVar1,0xd,iVar3,1);
    BufferHandle::operator=(&local_88,&local_70);
    BufferHandle::~BufferHandle(&local_70);
    local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::ExternalFileCache::CachedFileRange,std::allocator<duckdb::ExternalFileCache::CachedFileRange>,duckdb::shared_ptr<duckdb::BlockHandle,true>const&,unsigned_long_const&,unsigned_long_const&,std::__cxx11::string&>
              (&local_70.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (CachedFileRange **)&local_70,
               (allocator<duckdb::ExternalFileCache::CachedFileRange> *)&local_89,&local_88.handle,
               &local_98,&local_a0,&this->version_tag);
    local_58.internal.
    super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             local_70.handle.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.internal.
    super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_70.handle.internal.
         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.handle.internal.
         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        if (local_70.handle.internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0063c517;
      }
      else {
        (local_70.handle.internal.
         super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.handle.internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.handle.internal.
                 super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
LAB_0063c517:
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_88.node);
    *buffer = (local_88.node.ptr)->buffer;
    bVar2 = OnDiskFile(this);
    buffer_00 = *buffer;
    new_file_range_01 = new_file_range_00;
    if (bVar2) {
LAB_0063c56d:
      ReadAndCopyInterleaved
                (this,(vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_true>
                       *)&local_48,new_file_range_01,buffer_00,local_98,local_a0,true);
    }
    else {
      iVar3 = ReadAndCopyInterleaved
                        (this,(vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_true>
                               *)&local_48,new_file_range_00,buffer_00,local_98,local_a0,false);
      if (iVar3 < 2) {
        buffer_00 = *buffer;
        new_file_range_01 = extraout_RDX;
        goto LAB_0063c56d;
      }
      pFVar4 = GetFileHandle(this);
      FileHandle::Read(pFVar4,*buffer,local_98,local_a0);
    }
    TryInsertFileRange(__return_storage_ptr__,this,&local_88,buffer,local_98,local_a0,&local_58);
    if (local_58.internal.
        super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.internal.
                 super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
  ::~vector((vector<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>
             *)&local_48);
LAB_0063c5df:
  BufferHandle::~BufferHandle(&local_88);
  return __return_storage_ptr__;
}

Assistant:

BufferHandle CachingFileHandle::Read(data_ptr_t &buffer, const idx_t nr_bytes, const idx_t location) {
	BufferHandle result;
	if (!external_file_cache.IsEnabled()) {
		result = external_file_cache.GetBufferManager().Allocate(MemoryTag::EXTERNAL_FILE_CACHE, nr_bytes);
		buffer = result.Ptr();
		GetFileHandle().Read(buffer, nr_bytes, location);
		return result;
	}

	// Try to read from the cache, filling overlapping_ranges in the process
	vector<shared_ptr<CachedFileRange>> overlapping_ranges;
	result = TryReadFromCache(buffer, nr_bytes, location, overlapping_ranges);
	if (result.IsValid()) {
		return result; // Success
	}

	// Finally, if we weren't able to find the file range in the cache, we have to create a new file range
	result = external_file_cache.GetBufferManager().Allocate(MemoryTag::EXTERNAL_FILE_CACHE, nr_bytes);
	auto new_file_range = make_shared_ptr<CachedFileRange>(result.GetBlockHandle(), nr_bytes, location, version_tag);
	buffer = result.Ptr();

	// Interleave reading and copying from cached buffers
	if (OnDiskFile()) {
		// On-disk file: prefer interleaving reading and copying from cached buffers
		ReadAndCopyInterleaved(overlapping_ranges, new_file_range, buffer, nr_bytes, location, true);
	} else {
		// Remote file: prefer interleaving reading and copying from cached buffers only if reduces number of real reads
		if (ReadAndCopyInterleaved(overlapping_ranges, new_file_range, buffer, nr_bytes, location, false) <= 1) {
			ReadAndCopyInterleaved(overlapping_ranges, new_file_range, buffer, nr_bytes, location, true);
		} else {
			GetFileHandle().Read(buffer, nr_bytes, location);
		}
	}

	return TryInsertFileRange(result, buffer, nr_bytes, location, new_file_range);
}